

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint64_t uv__read_uint64(char *filename)

{
  int iVar1;
  uint64_t local_40;
  uint64_t rc;
  char buf [32];
  char *filename_local;
  
  local_40 = 0;
  iVar1 = uv__slurp(filename,(char *)&rc,0x20);
  if (((iVar1 == 0) && (iVar1 = sscanf((char *)&rc,"%lu",&local_40), iVar1 != 1)) &&
     (iVar1 = strcmp((char *)&rc,"max\n"), iVar1 == 0)) {
    local_40 = 0xffffffffffffffff;
  }
  return local_40;
}

Assistant:

static uint64_t uv__read_uint64(const char* filename) {
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    if (1 != sscanf(buf, "%" PRIu64, &rc))
      if (0 == strcmp(buf, "max\n"))
        rc = UINT64_MAX;

  return rc;
}